

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O0

HTS_File * HTS_fopen_from_fp(HTS_File *fp,size_t size)

{
  undefined8 *puVar1;
  void *pvVar2;
  size_t sVar3;
  size_t in_RSI;
  char *in_RDI;
  HTS_Data *tmp2;
  HTS_Data *tmp1;
  HTS_File *f_1;
  HTS_File *f;
  HTS_Data *d;
  size_t in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  long *num;
  HTS_File *local_8;
  
  if ((in_RDI == (char *)0x0) || (in_RSI == 0)) {
    local_8 = (HTS_File *)0x0;
  }
  else if (*in_RDI == '\0') {
    puVar1 = (undefined8 *)HTS_calloc(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    pvVar2 = HTS_calloc(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    *puVar1 = pvVar2;
    puVar1[1] = in_RSI;
    puVar1[2] = 0;
    sVar3 = fread((void *)*puVar1,1,in_RSI,*(FILE **)(in_RDI + 8));
    if (sVar3 == in_RSI) {
      local_8 = (HTS_File *)HTS_calloc(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      local_8->type = '\x01';
      local_8->pointer = puVar1;
    }
    else {
      free((void *)*puVar1);
      free(puVar1);
      local_8 = (HTS_File *)0x0;
    }
  }
  else if (*in_RDI == '\x01') {
    num = *(long **)(in_RDI + 8);
    if ((ulong)num[1] < num[2] + in_RSI) {
      local_8 = (HTS_File *)0x0;
    }
    else {
      puVar1 = (undefined8 *)HTS_calloc((size_t)num,in_stack_ffffffffffffffc0);
      pvVar2 = HTS_calloc((size_t)num,(size_t)puVar1);
      *puVar1 = pvVar2;
      puVar1[1] = in_RSI;
      puVar1[2] = 0;
      memcpy((void *)*puVar1,(void *)(*num + num[2]),in_RSI);
      num[2] = in_RSI + num[2];
      local_8 = (HTS_File *)HTS_calloc((size_t)num,(size_t)puVar1);
      local_8->type = '\x01';
      local_8->pointer = puVar1;
    }
  }
  else {
    HTS_error(0,"HTS_fopen_from_fp: Unknown file type.\n");
    local_8 = (HTS_File *)0x0;
  }
  return local_8;
}

Assistant:

HTS_File *HTS_fopen_from_fp(HTS_File * fp, size_t size)
{
   if (fp == NULL || size == 0)
      return NULL;
   else if (fp->type == HTS_FILE) {
      HTS_Data *d;
      HTS_File *f;
      d = (HTS_Data *) HTS_calloc(1, sizeof(HTS_Data));
      d->data = (unsigned char *) HTS_calloc(size, sizeof(unsigned char));
      d->size = size;
      d->index = 0;
      if (fread(d->data, sizeof(unsigned char), size, (FILE *) fp->pointer) != size) {
         free(d->data);
         free(d);
         return NULL;
      }
      f = (HTS_File *) HTS_calloc(1, sizeof(HTS_File));
      f->type = HTS_DATA;
      f->pointer = (void *) d;
      return f;
   } else if (fp->type == HTS_DATA) {
      HTS_File *f;
      HTS_Data *tmp1, *tmp2;
      tmp1 = (HTS_Data *) fp->pointer;
      if (tmp1->index + size > tmp1->size)
         return NULL;
      tmp2 = (HTS_Data *) HTS_calloc(1, sizeof(HTS_Data));
      tmp2->data = (unsigned char *) HTS_calloc(size, sizeof(unsigned char));
      tmp2->size = size;
      tmp2->index = 0;
      memcpy(tmp2->data, &tmp1->data[tmp1->index], size);
      tmp1->index += size;
      f = (HTS_File *) HTS_calloc(1, sizeof(HTS_File));
      f->type = HTS_DATA;
      f->pointer = (void *) tmp2;
      return f;
   }

   HTS_error(0, "HTS_fopen_from_fp: Unknown file type.\n");
   return NULL;
}